

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TreeEnsembleParameters_TreeNode * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode>
          (Arena *this)

{
  TreeEnsembleParameters_TreeNode *this_00;
  
  this_00 = (TreeEnsembleParameters_TreeNode *)
            AllocateAlignedWithHook
                      (this,0x70,
                       (type_info *)
                       &CoreML::Specification::TreeEnsembleParameters_TreeNode::typeinfo);
  CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
            (this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }